

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

long perfect_match(char *source,char *target,long sequence_length)

{
  char c2;
  char c1;
  long c;
  long matched_bases;
  long sequence_length_local;
  char *target_local;
  char *source_local;
  
  matched_bases = 0;
  c = 0;
  do {
    if (sequence_length <= c) {
      return matched_bases;
    }
    if ((source[c] != '\x11') && (target[c] != '\x11')) {
      if (source[c] != target[c]) {
        return -1;
      }
      matched_bases = matched_bases + 1;
    }
    c = c + 1;
  } while( true );
}

Assistant:

long perfect_match (const char* source, char* target, const long sequence_length) {
  long matched_bases = 0;
  for (long c = 0; c < sequence_length; c++) {
    char c1 = source[c],
    c2 = target[c];
    
    if (c1 == GAP || c2 == GAP) continue;
    
    if (c1 != c2) {
      return -1;
    }
    
    matched_bases ++;
  }
  return matched_bases;
}